

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O0

basic_binary_ostream<fail_flag_serialization_policy> *
detail::operator<<(ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                   *stream,person *value)

{
  size_t sVar1;
  span<std::byte> *psVar2;
  size_t sVar3;
  size_t size;
  person *value_local;
  ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
  *stream_local;
  
  if (((stream->
       super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
       ).super_fail_flag_serialization_policy.overflow & 1U) == 0) {
    sVar1 = get_serialized_size<person>(value);
    psVar2 = stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
             ::span(&stream->
                     super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                   );
    sVar3 = span<std::byte>::size(psVar2);
    if (sVar3 < sVar1) {
      (stream->
      super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
      stream_local = (ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      *)stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                        ::base(&stream->
                                super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                              );
    }
    else {
      psVar2 = stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
               ::span(&stream->
                       super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                     );
      serialize<person>(value,psVar2);
      stream_local = (ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      *)stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                        ::base(&stream->
                                super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                              );
    }
  }
  else {
    stream_local = (ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                    *)stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      ::base(&stream->
                              super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                            );
  }
  return (basic_binary_ostream<fail_flag_serialization_policy> *)stream_local;
}

Assistant:

StreamDerived& operator<<(ostream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T const& value) {
        if (stream.overflow) return stream.base();

        auto const size = get_serialized_size(value);
        if (size > stream.span().size()) {
            stream.overflow = true;
            return stream.base();
        }
        serialize(value, stream.span());
        return stream.base();
    }